

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O2

Vec_Int_t *
Gia_PolynCoreOrder_int
          (Gia_Man_t *pGia,Vec_Int_t *vAdds,Vec_Wec_t *vMap,Vec_Int_t *vRoots,Vec_Int_t **pvIns)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p;
  Vec_Bit_t *p_00;
  Vec_Int_t *pVVar4;
  int iVar5;
  int i;
  int iVar6;
  bool bVar7;
  
  p = Vec_IntAlloc(1000);
  p_00 = Vec_BitStart(pGia->nObjs);
  iVar5 = 0;
  while( true ) {
    iVar1 = vRoots->nSize;
    if (iVar1 <= iVar5) break;
    iVar1 = Vec_IntEntry(vRoots,iVar5);
    Vec_BitWriteEntry(p_00,iVar1,1);
    iVar5 = iVar5 + 1;
  }
  i = 0;
  iVar5 = -1;
  iVar2 = -1;
LAB_00533dc3:
  do {
    if (i < iVar1) {
      iVar1 = Vec_IntEntry(vRoots,i);
      pVVar4 = Vec_WecEntry(vMap,iVar1);
      iVar6 = 0;
      while( true ) {
        iVar3 = pVVar4->nSize;
        if (iVar3 <= iVar6 + 1) break;
        iVar5 = Vec_IntEntry(pVVar4,iVar6);
        iVar2 = Vec_IntEntry(pVVar4,iVar6 + 1);
        iVar3 = Vec_BitEntry(p_00,iVar2);
        if (iVar3 != 0) {
          iVar3 = pVVar4->nSize;
          break;
        }
        iVar6 = iVar6 + 2;
      }
      if (iVar3 == iVar6) {
        i = i + 1;
        iVar1 = vRoots->nSize;
        goto LAB_00533dc3;
      }
      iVar6 = Vec_BitEntry(p_00,iVar1);
      if (iVar6 == 0) {
        __assert_fail("Vec_BitEntry(vIsRoot, Entry1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCo.c"
                      ,0x80,
                      "Vec_Int_t *Gia_PolynCoreOrder_int(Gia_Man_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t **)"
                     );
      }
      iVar6 = Vec_BitEntry(p_00,iVar2);
      if (iVar6 == 0) {
        __assert_fail("Vec_BitEntry(vIsRoot, Entry2)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCo.c"
                      ,0x81,
                      "Vec_Int_t *Gia_PolynCoreOrder_int(Gia_Man_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t **)"
                     );
      }
      Vec_IntPush(p,iVar5);
      Vec_BitWriteEntry(p_00,iVar1,0);
      Vec_BitWriteEntry(p_00,iVar2,0);
      Vec_IntRemove(vRoots,iVar1);
      Vec_IntRemove(vRoots,iVar2);
      iVar6 = iVar5 * 6;
      iVar1 = Vec_IntEntry(vAdds,iVar6);
      iVar2 = Vec_IntEntry(vAdds,iVar6 + 1);
      iVar6 = Vec_IntEntry(vAdds,iVar6 + 2);
      Vec_BitWriteEntry(p_00,iVar1,1);
      Vec_BitWriteEntry(p_00,iVar2,1);
      Vec_BitWriteEntry(p_00,iVar6,1);
      Vec_IntPushUnique(vRoots,iVar1);
      Vec_IntPushUnique(vRoots,iVar2);
      Vec_IntPushUnique(vRoots,iVar6);
      iVar1 = vRoots->nSize;
    }
    bVar7 = i == iVar1;
    i = 0;
    if (bVar7) {
      iVar5 = 1;
      if (pvIns != (Vec_Int_t **)0x0) {
        iVar1 = p_00->nSize;
        pVVar4 = Vec_IntAlloc(iVar1);
        *pvIns = pVVar4;
        for (; iVar5 < iVar1; iVar5 = iVar5 + 1) {
          iVar2 = Vec_BitEntry(p_00,iVar5);
          if (iVar2 != 0) {
            Vec_IntPush(*pvIns,iVar5);
          }
        }
      }
      Vec_BitFree(p_00);
      return p;
    }
  } while( true );
}

Assistant:

Vec_Int_t * Gia_PolynCoreOrder_int( Gia_Man_t * pGia, Vec_Int_t * vAdds, Vec_Wec_t * vMap, Vec_Int_t * vRoots, Vec_Int_t ** pvIns )
{
    Vec_Int_t * vOrder  = Vec_IntAlloc( 1000 );
    Vec_Bit_t * vIsRoot = Vec_BitStart( Gia_ManObjNum(pGia) );
    int i, k, Index = -1, Driver, Entry1, Entry2 = -1;
    // mark roots
    Vec_IntForEachEntry( vRoots, Driver, i )
        Vec_BitWriteEntry( vIsRoot, Driver, 1 );
    // collect boxes
    while ( 1 )
    {
        // iterate through boxes driving this one
        Vec_IntForEachEntry( vRoots, Entry1, i )
        {
            Vec_Int_t * vLevel = Vec_WecEntry( vMap, Entry1 );
            Vec_IntForEachEntryDouble( vLevel, Index, Entry2, k )
                if ( Vec_BitEntry(vIsRoot, Entry2) )
                    break;
            if ( k == Vec_IntSize(vLevel) )
                continue;
            assert( Vec_BitEntry(vIsRoot, Entry1) );
            assert( Vec_BitEntry(vIsRoot, Entry2) );
            // collect adder
            Vec_IntPush( vOrder, Index );
            // clean marks
            Vec_BitWriteEntry( vIsRoot, Entry1, 0 );
            Vec_BitWriteEntry( vIsRoot, Entry2, 0 );
            Vec_IntRemove( vRoots, Entry1 );
            Vec_IntRemove( vRoots, Entry2 );
            // set new marks
            Entry1 = Vec_IntEntry( vAdds, 6*Index + 0 );
            Entry2 = Vec_IntEntry( vAdds, 6*Index + 1 );
            Driver = Vec_IntEntry( vAdds, 6*Index + 2 );
            Vec_BitWriteEntry( vIsRoot, Entry1, 1 );
            Vec_BitWriteEntry( vIsRoot, Entry2, 1 );
            Vec_BitWriteEntry( vIsRoot, Driver, 1 );
            Vec_IntPushUnique( vRoots, Entry1 );
            Vec_IntPushUnique( vRoots, Entry2 );
            Vec_IntPushUnique( vRoots, Driver );
            break;
        }
        if ( i == Vec_IntSize(vRoots) )
            break;
    }
    // collect remaining leaves
    if ( pvIns )
    {
        *pvIns = Vec_IntAlloc( Vec_BitSize(vIsRoot) );
        Vec_BitForEachEntryStart( vIsRoot, Driver, i, 1 )
            if ( Driver )
                Vec_IntPush( *pvIns, i );
    }
    Vec_BitFree( vIsRoot );
    return vOrder;
}